

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSModuleDef * JS_NewCModule(JSContext *ctx,char *name_str,JSModuleInitFunc *func)

{
  JSAtom JVar1;
  JSContext *in_RDX;
  JSAtom name;
  JSModuleDef *m;
  char *in_stack_ffffffffffffffd8;
  JSModuleDef *local_8;
  
  JVar1 = JS_NewAtom(in_RDX,in_stack_ffffffffffffffd8);
  if (JVar1 == 0) {
    local_8 = (JSModuleDef *)0x0;
  }
  else {
    local_8 = js_new_module_def((JSContext *)func,m._4_4_);
    local_8->init_func = (JSModuleInitFunc *)in_RDX;
  }
  return local_8;
}

Assistant:

JSModuleDef *JS_NewCModule(JSContext *ctx, const char *name_str,
                           JSModuleInitFunc *func)
{
    JSModuleDef *m;
    JSAtom name;
    name = JS_NewAtom(ctx, name_str);
    if (name == JS_ATOM_NULL)
        return NULL;
    m = js_new_module_def(ctx, name);
    m->init_func = func;
    return m;
}